

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON_bool cJSON_PrintPreallocated(cJSON *item,char *buf,int len,cJSON_bool fmt)

{
  long in_FS_OFFSET;
  cJSON_bool fmt_local;
  int len_local;
  char *buf_local;
  cJSON *item_local;
  undefined1 local_50 [8];
  printbuffer p;
  
  p.hooks.reallocate = *(_func_void_ptr_void_ptr_size_t **)(in_FS_OFFSET + 0x28);
  memset(local_50,0,0x40);
  if (len < 0) {
    item_local._4_4_ = 0;
  }
  else {
    p.buffer = (uchar *)(long)len;
    p.length = 0;
    p.depth._0_4_ = 1;
    p._32_8_ = global_hooks.allocate;
    p.hooks.allocate = (_func_void_ptr_size_t *)global_hooks.deallocate;
    p.hooks.deallocate = (_func_void_void_ptr *)global_hooks.reallocate;
    local_50 = (undefined1  [8])buf;
    p.depth._4_4_ = fmt;
    item_local._4_4_ = print_value(item,(printbuffer *)local_50);
  }
  if (*(_func_void_ptr_void_ptr_size_t **)(in_FS_OFFSET + 0x28) == p.hooks.reallocate) {
    return item_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

CJSON_PUBLIC(cJSON_bool) cJSON_PrintPreallocated(cJSON *item, char *buf, const int len, const cJSON_bool fmt)
{
    printbuffer p = { 0, 0, 0, 0, 0, 0, { 0, 0, 0 } };

    if (len < 0)
    {
        return false;
    }

    p.buffer = (unsigned char*)buf;
    p.length = (size_t)len;
    p.offset = 0;
    p.noalloc = true;
    p.format = fmt;
    p.hooks = global_hooks;

    return print_value(item, &p);
}